

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O0

void __thiscall Saturation::SaturationAlgorithm::onPassiveAdded(SaturationAlgorithm *this,Clause *c)

{
  bool bVar1;
  ostream *this_00;
  Clause *in_stack_00000788;
  Clause *in_stack_ffffffffffffff98;
  Options *in_stack_ffffffffffffffa0;
  string local_30 [48];
  
  bVar1 = Shell::Options::showPassive(in_stack_ffffffffffffffa0);
  if (bVar1) {
    in_stack_ffffffffffffffa0 = (Options *)std::operator<<((ostream *)&std::cout,"[SA] passive: ");
    Kernel::Clause::toString_abi_cxx11_(in_stack_00000788);
    this_00 = std::operator<<((ostream *)in_stack_ffffffffffffffa0,local_30);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_30);
  }
  onNonRedundantClause((SaturationAlgorithm *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  return;
}

Assistant:

void SaturationAlgorithm::onPassiveAdded(Clause* c)
{
  if (env.options->showPassive()) {
    std::cout << "[SA] passive: " << c->toString() << std::endl;
  }

  //when a clause is added to the passive container,
  //we know it is not redundant
  onNonRedundantClause(c);
}